

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

uint32_t mpack_expect_str(mpack_reader_t *reader)

{
  byte bVar1;
  uint16_t uVar2;
  uint local_20;
  uint32_t count;
  uint8_t type;
  mpack_reader_t *reader_local;
  
  bVar1 = mpack_expect_type_byte(reader);
  if ((int)(uint)bVar1 >> 5 == 5) {
    local_20 = bVar1 & 0x1f;
  }
  else if (bVar1 == 0xd9) {
    bVar1 = mpack_expect_native_u8(reader);
    local_20 = (uint)bVar1;
  }
  else if (bVar1 == 0xda) {
    uVar2 = mpack_expect_native_u16(reader);
    local_20 = (uint)uVar2;
  }
  else {
    if (bVar1 != 0xdb) {
      mpack_reader_flag_error(reader,mpack_error_type);
      return 0;
    }
    local_20 = mpack_expect_native_u32(reader);
  }
  return local_20;
}

Assistant:

uint32_t mpack_expect_str(mpack_reader_t* reader) {
    #if MPACK_OPTIMIZE_FOR_SIZE
    mpack_tag_t var = mpack_read_tag(reader);
    if (var.type == mpack_type_str)
        return var.v.l;
    mpack_reader_flag_error(reader, mpack_error_type);
    return 0;
    #else
    uint8_t type = mpack_expect_type_byte(reader);
    uint32_t count;

    if ((type >> 5) == 5) {
        count = type & (uint8_t)~0xe0;
    } else if (type == 0xd9) {
        count = mpack_expect_native_u8(reader);
    } else if (type == 0xda) {
        count = mpack_expect_native_u16(reader);
    } else if (type == 0xdb) {
        count = mpack_expect_native_u32(reader);
    } else {
        mpack_reader_flag_error(reader, mpack_error_type);
        return 0;
    }

    #if MPACK_READ_TRACKING
    mpack_reader_flag_if_error(reader, mpack_track_push(&reader->track, mpack_type_str, count));
    #endif
    return count;
    #endif
}